

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O2

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  size_t _elemsize;
  pointer pMVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  void *pvVar14;
  ulong uVar15;
  int j;
  uint uVar16;
  ulong uVar17;
  void *pvVar18;
  int k;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  float fVar22;
  int local_e0;
  Mat A;
  Mat B;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  _elemsize = pMVar3->elemsize;
  A.cstep = 0;
  A.data = (void *)0x0;
  A.refcount._0_4_ = 0;
  A.refcount._4_4_ = 0;
  A.elemsize._0_4_ = 0;
  A.elemsize._4_4_ = 0;
  A.elempack = 0;
  A.allocator = (Allocator *)0x0;
  A.dims = 0;
  A.w = 0;
  A.h = 0;
  A.d = 0;
  A.c = 0;
  if (this->transA == 0) {
    Mat::operator=(&A,pMVar3);
  }
  else {
    Mat::create(&A,pMVar3->h,pMVar3->w,_elemsize,opt->workspace_allocator);
    uVar10 = 0;
    uVar11 = 0;
    if (0 < A.w) {
      uVar11 = (ulong)(uint)A.w;
    }
    uVar12 = (ulong)(uint)A.h;
    pvVar14 = A.data;
    if (A.h < 1) {
      uVar12 = uVar10;
    }
    for (; uVar10 != uVar12; uVar10 = uVar10 + 1) {
      for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
        *(undefined4 *)((long)pvVar14 + uVar17 * 4) =
             *(undefined4 *)
              ((long)pMVar3->data + uVar10 * 4 + (long)pMVar3->w * uVar17 * pMVar3->elemsize);
      }
      pvVar14 = (void *)((long)pvVar14 +
                        (long)A.w * CONCAT44(A.elemsize._4_4_,(undefined4)A.elemsize));
    }
  }
  B.cstep = 0;
  B.data = (void *)0x0;
  B.refcount._0_4_ = 0;
  B.refcount._4_4_ = 0;
  B.elemsize._0_4_ = 0;
  B.elemsize._4_4_ = 0;
  B.elempack = 0;
  B.allocator = (Allocator *)0x0;
  B.dims = 0;
  B.w = 0;
  B.h = 0;
  B.d = 0;
  B.c = 0;
  if (this->transB == 0) {
    Mat::create(&B,pMVar3[1].h,pMVar3[1].w,_elemsize,opt->workspace_allocator);
    uVar10 = 0;
    uVar11 = 0;
    if (0 < B.w) {
      uVar11 = (ulong)(uint)B.w;
    }
    uVar12 = 0;
    pvVar14 = B.data;
    if (0 < B.h) {
      uVar12 = (ulong)(uint)B.h;
    }
    for (; uVar10 != uVar12; uVar10 = uVar10 + 1) {
      for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
        *(undefined4 *)((long)pvVar14 + uVar17 * 4) =
             *(undefined4 *)
              ((long)pMVar3[1].data + uVar10 * 4 + (long)pMVar3[1].w * uVar17 * pMVar3[1].elemsize);
      }
      pvVar14 = (void *)((long)pvVar14 +
                        (long)B.w * CONCAT44(B.elemsize._4_4_,(undefined4)B.elemsize));
    }
  }
  else {
    Mat::operator=(&B,pMVar3 + 1);
  }
  iVar6 = B.h;
  iVar7 = A.h;
  uVar5 = A.w;
  uVar10 = (ulong)(uint)A.h;
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4;
  if (lVar20 == 0xd8) {
    iVar1 = pMVar4[2].w;
    bVar21 = iVar1 == A.h && pMVar4[2].dims == 1;
    uVar16 = (uint)bVar21;
    iVar2 = pMVar4[2].h;
    uVar13 = 2;
    if (iVar2 != A.h) {
      uVar13 = (uint)bVar21;
    }
    if (iVar1 != 1) {
      uVar13 = uVar16;
    }
    bVar21 = pMVar4[2].dims != 2;
    if (bVar21) {
      uVar13 = uVar16;
    }
    uVar16 = 3;
    if (iVar2 != A.h) {
      uVar16 = uVar13;
    }
    if (bVar21 || iVar1 != B.h) {
      uVar16 = uVar13;
    }
    uVar11 = 4;
    if (iVar2 != 1) {
      uVar11 = (ulong)uVar16;
    }
    pvVar14 = pMVar4[2].data;
    if (bVar21 || iVar1 != B.h) {
      uVar11 = (ulong)uVar16;
    }
  }
  else {
    pvVar14 = (void *)0x0;
    uVar11 = 0;
  }
  pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create(pMVar3,B.h,A.h,_elemsize,opt->blob_allocator);
  pfVar8 = (float *)pMVar3->data;
  local_e0 = -100;
  if ((pfVar8 != (float *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    uVar12 = 0;
    if (0 < iVar6) {
      uVar12 = (ulong)(uint)iVar6;
    }
    local_e0 = 0;
    if (iVar7 < 1) {
      uVar10 = 0;
    }
    pvVar9 = A.data;
    for (uVar17 = 0; uVar17 != uVar10; uVar17 = uVar17 + 1) {
      pvVar18 = B.data;
      for (uVar15 = 0; uVar15 != uVar12; uVar15 = uVar15 + 1) {
        fVar22 = 0.0;
        if (lVar20 == 0xd8) {
          iVar7 = (*(code *)(&DAT_002dd220 + *(int *)(&DAT_002dd220 + uVar11 * 4)))
                            (uVar15,uVar12,(void *)((long)pvVar14 + uVar17 * 4));
          return iVar7;
        }
        for (uVar19 = 0; uVar5 != uVar19; uVar19 = uVar19 + 1) {
          fVar22 = fVar22 + *(float *)((long)pvVar18 + uVar19 * 4) *
                            *(float *)((long)pvVar9 + uVar19 * 4);
        }
        *pfVar8 = fVar22 * this->alpha;
        pfVar8 = pfVar8 + 1;
        pvVar18 = (void *)((long)pvVar18 +
                          (long)B.w * CONCAT44(B.elemsize._4_4_,(undefined4)B.elemsize));
      }
      pvVar9 = (void *)((long)pvVar9 + (long)A.w * CONCAT44(A.elemsize._4_4_,(undefined4)A.elemsize)
                       );
    }
  }
  Mat::~Mat(&B);
  Mat::~Mat(&A);
  return local_e0;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = bottom_blobs[0];
    const Mat& B0 = bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create(A0.h, A0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0.row(j)[i];
            }
        }
    }

    Mat B;
    if (transB == 0)
    {
        // transpose B to col-major
        B.create(B0.h, B0.w, elemsize, opt.workspace_allocator);

        for (int i = 0; i < B.h; i++)
        {
            float* ptr = B.row(i);
            for (int j = 0; j < B.w; j++)
            {
                ptr[j] = B0.row(j)[i];
            }
        }
    }
    else
    {
        B = B0;
    }

    int M = A.h;
    int K = A.w; // assert A.w == B.w
    int N = B.h;

    bool has_C = bottom_blobs.size() == 3;

    const float* ptrC = 0;
    int broadcast_type_C = 0;
    if (has_C)
    {
        const Mat& C = bottom_blobs[2];

        ptrC = C;

        if (C.dims == 1 && C.w == 1)
        {
            // scalar
            broadcast_type_C = 0;
        }
        if (C.dims == 1 && C.w == M)
        {
            // M
            // auto broadcast from h to w is the ncnn-style convention
            broadcast_type_C = 1;
        }
        if (C.dims == 2 && C.w == 1 && C.h == M)
        {
            // Mx1
            broadcast_type_C = 2;
        }
        if (C.dims == 2 && C.w == N && C.h == M)
        {
            // MxN
            broadcast_type_C = 3;
        }
        if (C.dims == 2 && C.w == N && C.h == 1)
        {
            // 1xN
            broadcast_type_C = 4;
        }
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(N, M, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    float* outptr = top_blob;
    for (int i = 0; i < M; i++)
    {
        const float* ptrA = A.row(i);

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = B.row(j);

            float sum = 0.f;
            if (has_C)
            {
                if (broadcast_type_C == 0)
                {
                    sum = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    sum = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    sum = ptrC[j];
                }

                sum *= beta;
            }

            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            *outptr++ = sum * alpha;
        }
    }

    return 0;
}